

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  int iVar1;
  SnapPromiseResolveOrRejectFunctionInfo *addtlInfo;
  TTD_PTR_ID TVar2;
  
  addtlInfo = (SnapPromiseResolveOrRejectFunctionInfo *)
              SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  TVar2 = FileReader::ReadAddr(reader,ptrIdVal,true);
  addtlInfo->PromiseId = TVar2;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->IsReject = SUB41(iVar1,0);
  TVar2 = FileReader::ReadAddr(reader,ptrIdVal,true);
  addtlInfo->AlreadyResolvedWrapperId = TVar2;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->AlreadyResolvedValue = SUB41(iVar1,0);
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseResolveOrRejectFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)29>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseResolveOrRejectFunctionInfo* rrfInfo = alloc.SlabAllocateStruct<SnapPromiseResolveOrRejectFunctionInfo>();

            rrfInfo->PromiseId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            rrfInfo->IsReject = reader->ReadBool(NSTokens::Key::boolVal, true);

            rrfInfo->AlreadyResolvedWrapperId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            rrfInfo->AlreadyResolvedValue = reader->ReadBool(NSTokens::Key::boolVal, true);

            SnapObjectSetAddtlInfoAs<SnapPromiseResolveOrRejectFunctionInfo*, SnapObjectType::SnapPromiseResolveOrRejectFunctionObject>(snpObject, rrfInfo);
        }